

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBlif.c
# Opt level: O1

void Io_WriteBlifInt(Abc_Ntk_t *pNtk,char *FileName,char *pLutStruct,int fUseHie)

{
  char *pcVar1;
  Abc_Obj_t *pAVar2;
  FILE *__stream;
  char *pcVar3;
  Vec_Int_t *vCover;
  int *piVar4;
  Vec_Ptr_t *pVVar5;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar6;
  long lVar7;
  
  if (pNtk->ntkType != ABC_NTK_NETLIST) {
    __assert_fail("Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteBlif.c"
                  ,0x526,"void Io_WriteBlifInt(Abc_Ntk_t *, char *, char *, int)");
  }
  __stream = fopen(FileName,"w");
  if (__stream != (FILE *)0x0) {
    pcVar1 = pNtk->pName;
    pcVar3 = Extra_TimeStamp();
    fprintf(__stream,"# Benchmark \"%s\" written by ABC on %s\n",pcVar1,pcVar3);
    fprintf(__stream,".model %s\n",pNtk->pName);
    fwrite(".inputs",7,1,__stream);
    Io_NtkWritePis((FILE *)__stream,pNtk,1);
    fputc(10,__stream);
    fwrite(".outputs",8,1,__stream);
    Io_NtkWritePos((FILE *)__stream,pNtk,1);
    fputc(10,__stream);
    if (pNtk->nObjCounts[8] != 0) {
      fputc(10,__stream);
    }
    pVVar5 = pNtk->vBoxes;
    if (0 < pVVar5->nSize) {
      lVar7 = 0;
      do {
        if ((*(uint *)&((Abc_Obj_t *)pVVar5->pArray[lVar7])->field_0x14 & 0xf) == 8) {
          Io_NtkWriteLatch((FILE *)__stream,(Abc_Obj_t *)pVVar5->pArray[lVar7]);
        }
        lVar7 = lVar7 + 1;
        pVVar5 = pNtk->vBoxes;
      } while (lVar7 < pVVar5->nSize);
    }
    if (pNtk->nObjCounts[8] != 0) {
      fputc(10,__stream);
    }
    vCover = (Vec_Int_t *)malloc(0x10);
    vCover->nCap = 0x10000;
    vCover->nSize = 0;
    piVar4 = (int *)malloc(0x40000);
    vCover->pArray = piVar4;
    if (fUseHie == 0) {
      pVVar5 = pNtk->vObjs;
      if (0 < pVVar5->nSize) {
        lVar7 = 0;
        do {
          pAVar2 = (Abc_Obj_t *)pVVar5->pArray[lVar7];
          if ((pAVar2 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar2->field_0x14 & 0xf) == 7)) {
            if (pLutStruct == (char *)0x0) {
              Io_NtkWriteNodeInt((FILE *)__stream,pAVar2,vCover);
            }
            else {
              Io_NtkWriteNodeIntStruct((FILE *)__stream,pAVar2,vCover,pLutStruct);
            }
          }
          lVar7 = lVar7 + 1;
          pVVar5 = pNtk->vObjs;
        } while (lVar7 < pVVar5->nSize);
      }
      fwrite(".end\n\n",6,1,__stream);
    }
    else {
      fputc(10,__stream);
      pVVar5 = pNtk->vObjs;
      if (0 < pVVar5->nSize) {
        lVar7 = 0;
        uVar6 = extraout_RDX;
        do {
          pAVar2 = (Abc_Obj_t *)pVVar5->pArray[lVar7];
          if ((pAVar2 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar2->field_0x14 & 0xf) == 7)) {
            Io_NtkWriteNodeSubckt((FILE *)__stream,pAVar2,(int)uVar6);
            uVar6 = extraout_RDX_00;
          }
          lVar7 = lVar7 + 1;
          pVVar5 = pNtk->vObjs;
        } while (lVar7 < pVVar5->nSize);
      }
      fwrite(".end\n\n",6,1,__stream);
      pVVar5 = pNtk->vObjs;
      if (0 < pVVar5->nSize) {
        lVar7 = 0;
        do {
          pAVar2 = (Abc_Obj_t *)pVVar5->pArray[lVar7];
          if ((pAVar2 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar2->field_0x14 & 0xf) == 7)) {
            Io_NtkWriteModelIntStruct((FILE *)__stream,pAVar2,vCover,pLutStruct);
          }
          lVar7 = lVar7 + 1;
          pVVar5 = pNtk->vObjs;
        } while (lVar7 < pVVar5->nSize);
      }
      fputc(10,__stream);
    }
    if (vCover->pArray != (int *)0x0) {
      free(vCover->pArray);
      vCover->pArray = (int *)0x0;
    }
    free(vCover);
    fclose(__stream);
    return;
  }
  fwrite("Io_WriteBlifInt(): Cannot open the output file.\n",0x30,1,_stdout);
  return;
}

Assistant:

void Io_WriteBlifInt( Abc_Ntk_t * pNtk, char * FileName, char * pLutStruct, int fUseHie )
{
    FILE * pFile;
    Vec_Int_t * vCover;
    Abc_Obj_t * pNode, * pLatch;
    int i;
    assert( Abc_NtkIsNetlist(pNtk) );
    // start writing the file
    pFile = fopen( FileName, "w" );
    if ( pFile == NULL )
    {
        fprintf( stdout, "Io_WriteBlifInt(): Cannot open the output file.\n" );
        return;
    }
    fprintf( pFile, "# Benchmark \"%s\" written by ABC on %s\n", pNtk->pName, Extra_TimeStamp() );
    // write the model name
    fprintf( pFile, ".model %s\n", Abc_NtkName(pNtk) );
    // write the PIs
    fprintf( pFile, ".inputs" );
    Io_NtkWritePis( pFile, pNtk, 1 );
    fprintf( pFile, "\n" );
    // write the POs
    fprintf( pFile, ".outputs" );
    Io_NtkWritePos( pFile, pNtk, 1 );
    fprintf( pFile, "\n" );
    // write the latches
    if ( Abc_NtkLatchNum(pNtk) )
        fprintf( pFile, "\n" );
    Abc_NtkForEachLatch( pNtk, pLatch, i )
        Io_NtkWriteLatch( pFile, pLatch );
    if ( Abc_NtkLatchNum(pNtk) )
        fprintf( pFile, "\n" );
    // write the hierarchy
    vCover = Vec_IntAlloc( (1<<16) );
    if ( fUseHie )
    {
        // write each internal node
        fprintf( pFile, "\n" );
        Abc_NtkForEachNode( pNtk, pNode, i )
            Io_NtkWriteNodeSubckt( pFile, pNode, 0 );
        fprintf( pFile, ".end\n\n" );
        // write models
        Abc_NtkForEachNode( pNtk, pNode, i )
            Io_NtkWriteModelIntStruct( pFile, pNode, vCover, pLutStruct );
        fprintf( pFile, "\n" );
    }
    else
    {
        // write each internal node
        Abc_NtkForEachNode( pNtk, pNode, i )
        {
            if ( pLutStruct )
                Io_NtkWriteNodeIntStruct( pFile, pNode, vCover, pLutStruct );
            else
                Io_NtkWriteNodeInt( pFile, pNode, vCover );
        }
        fprintf( pFile, ".end\n\n" );
    }
    Vec_IntFree( vCover );
    fclose( pFile );
}